

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O3

cubeb_resampler *
cubeb_resampler_create_internal<float>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  cubeb_log_level cVar5;
  cubeb_resampler_speex_one_way<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  delay_line<float> *pdVar6;
  cubeb_data_callback p_Var7;
  cubeb_log_callback p_Var8;
  passthrough_resampler<float> *this_01;
  code *pcVar9;
  uint32_t uVar10;
  uint source_rate;
  delay_line<float> *local_40;
  delay_line<float> *local_38;
  
  local_38 = (delay_line<float> *)0x0;
  local_40 = (delay_line<float> *)0x0;
  if (input_params == (cubeb_stream_params *)0x0) {
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_001141b2;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_001143b5:
    cVar5 = cubeb_log_get_level();
    if ((0 < (int)cVar5) && (p_Var8 = cubeb_log_get_callback(), p_Var8 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x267,
                         "Resampling output (%dHz) to target and input rate of %dHz",
                         (ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    pdVar6 = local_38;
    local_38 = (delay_line<float> *)0x0;
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b960;
    *(delay_line<float> **)&this_01->super_processor = pdVar6;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)stream;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0 && pdVar6 == (delay_line<float> *)0x0)
    goto LAB_001145b8;
    pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_duplex;
    if (pdVar6 == (delay_line<float> *)0x0) {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_input;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_input;
    }
    p_Var7 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_output;
    if (pdVar6 != (delay_line<float> *)0x0) {
      p_Var7 = pcVar9;
    }
  }
  else {
    source_rate = input_params->rate;
    if (output_params != (cubeb_stream_params *)0x0 && source_rate == target_rate) {
LAB_001141b2:
      if (output_params->rate == target_rate) {
LAB_001141b8:
        cVar5 = cubeb_log_get_level();
        if ((0 < (int)cVar5) &&
           (p_Var8 = cubeb_log_get_callback(), p_Var8 != (cubeb_log_callback)0x0)) {
          cubeb_log_internal("cubeb_resampler_internal.h",0x229,
                             "Input and output sample-rate match, target rate of %dHz",
                             (ulong)target_rate);
        }
        this_01 = (passthrough_resampler<float> *)operator_new(0x48);
        if (input_params == (cubeb_stream_params *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = input_params->channels;
        }
        passthrough_resampler<float>::passthrough_resampler
                  (this_01,stream,callback,user_ptr,uVar10,target_rate);
        goto LAB_001145b8;
      }
LAB_0011420c:
      uVar10 = output_params->rate;
      if (uVar10 == target_rate) {
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar3 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this,output_params->channels,target_rate,uVar10,iVar3);
      }
      if (input_params != (cubeb_stream_params *)0x0) {
        source_rate = input_params->rate;
        bVar2 = true;
        goto LAB_0011426e;
      }
      bVar2 = true;
LAB_0011432c:
      if (this == (cubeb_resampler_speex_one_way<float> *)0x0) {
        this = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else if (bVar2 && input_params != (cubeb_stream_params *)0x0) {
        pdVar6 = (delay_line<float> *)operator_new(0x48);
        iVar3 = speex_resampler_get_output_latency(this->speex_resampler);
        uVar4 = iVar3 + this->additional_latency;
        uVar10 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar6->super_processor).channels = uVar10;
        pdVar6->length = uVar4;
        pdVar6->leftover_samples = 0;
        (pdVar6->delay_output_buffer).capacity_ = 0;
        (pdVar6->delay_output_buffer).length_ = 0;
        (pdVar6->delay_input_buffer).length_ = 0;
        (pdVar6->delay_output_buffer).data_ = (float *)0x0;
        (pdVar6->delay_input_buffer).data_ = (float *)0x0;
        (pdVar6->delay_input_buffer).capacity_ = 0;
        pdVar6->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar6->delay_input_buffer,(ulong)(uVar10 * uVar4));
        local_38 = pdVar6;
      }
      goto LAB_001143b5;
    }
    if (output_params != (cubeb_stream_params *)0x0) goto LAB_0011420c;
    if (source_rate == target_rate) goto LAB_001141b8;
    this = (cubeb_resampler_speex_one_way<float> *)0x0;
    bVar2 = false;
LAB_0011426e:
    if (source_rate == target_rate) goto LAB_0011432c;
    this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
    iVar3 = -1;
    if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
      iVar3 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
    }
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
              (this_00,input_params->channels,source_rate,target_rate,iVar3);
    if ((bool)(bVar2 & input_params != (cubeb_stream_params *)0x0 &
              this == (cubeb_resampler_speex_one_way<float> *)0x0)) {
      pdVar6 = (delay_line<float> *)operator_new(0x48);
      iVar3 = speex_resampler_get_output_latency(this_00->speex_resampler);
      uVar4 = iVar3 + this_00->additional_latency;
      uVar10 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar6->super_processor).channels = uVar1;
      pdVar6->length = uVar4;
      pdVar6->leftover_samples = 0;
      (pdVar6->delay_output_buffer).capacity_ = 0;
      (pdVar6->delay_output_buffer).length_ = 0;
      (pdVar6->delay_input_buffer).length_ = 0;
      (pdVar6->delay_output_buffer).data_ = (float *)0x0;
      (pdVar6->delay_input_buffer).data_ = (float *)0x0;
      (pdVar6->delay_input_buffer).capacity_ = 0;
      pdVar6->sample_rate = uVar10;
      auto_array<float>::push_silence(&pdVar6->delay_input_buffer,(ulong)(uVar1 * uVar4));
      local_40 = pdVar6;
LAB_0011451d:
      cVar5 = cubeb_log_get_level();
      if ((0 < (int)cVar5) && (p_Var8 = cubeb_log_get_callback(), p_Var8 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x260,
                           "Resampling input (%d) to target and output rate of %dHz",
                           (ulong)input_params->rate,(ulong)target_rate);
      }
      this_01 = (passthrough_resampler<float> *)operator_new(0x48);
      pdVar6 = local_40;
      local_40 = (delay_line<float> *)0x0;
      (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b928;
      *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
      this_01->stream = (cubeb_stream *)pdVar6;
      (this_01->internal_input_buffer).data_ = (float *)stream;
      (this_01->internal_input_buffer).capacity_ = (size_t)callback;
      (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
      *(undefined1 *)&this_01->sample_rate = 0;
      pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
               ::fill_internal_duplex;
      if (pdVar6 == (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_input;
      }
      this_01->data_callback = pcVar9;
      this_01->user_ptr = (void *)0x0;
      goto LAB_001145b8;
    }
    if (this == (cubeb_resampler_speex_one_way<float> *)0x0) goto LAB_0011451d;
    cVar5 = cubeb_log_get_level();
    if ((0 < (int)cVar5) && (p_Var8 = cubeb_log_get_callback(), p_Var8 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x259,
                         "Resampling input (%d) and output (%d) to target rate of %dHz",
                         (ulong)input_params->rate,(ulong)output_params->rate,(ulong)target_rate);
    }
    this_01 = (passthrough_resampler<float> *)operator_new(0x48);
    (this_01->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b8f0;
    *(cubeb_resampler_speex_one_way<float> **)&this_01->super_processor = this_00;
    this_01->stream = (cubeb_stream *)this;
    (this_01->internal_input_buffer).data_ = (float *)stream;
    (this_01->internal_input_buffer).capacity_ = (size_t)callback;
    (this_01->internal_input_buffer).length_ = (size_t)user_ptr;
    *(undefined1 *)&this_01->sample_rate = 0;
    p_Var7 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
             ::fill_internal_duplex;
  }
  this_01->data_callback = p_Var7;
  this_01->user_ptr = (void *)0x0;
LAB_001145b8:
  if (local_40 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&local_40,local_40);
  }
  if (local_38 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&local_38,local_38);
  }
  return &this_01->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to
     the callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}